

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

char * ImGui::TableGetColumnName(int column_n)

{
  ImGuiTable *table;
  char *pcVar1;
  
  table = GImGui->CurrentTable;
  if (table == (ImGuiTable *)0x0) {
    return (char *)0x0;
  }
  if (column_n < 0) {
    pcVar1 = TableGetColumnName(table,table->CurrentColumn);
    return pcVar1;
  }
  pcVar1 = TableGetColumnName(table,column_n);
  return pcVar1;
}

Assistant:

const char*   ImGui::TableGetColumnName(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return NULL;
    if (column_n < 0)
        column_n = table->CurrentColumn;
    return TableGetColumnName(table, column_n);
}